

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData *data)

{
  iterator __first;
  iterator __last;
  iterator this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  const_iterator in_stack_ffffffffffffff98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  ByteData *data_local;
  ByteData *this_local;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffa0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff98._M_current);
  GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,data);
  local_70._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&stack0xffffffffffffff98,&local_70);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      (in_stack_ffffffffffffff48);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     (in_stack_ffffffffffffff48);
  this_00 = ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                       &insert_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,in_stack_ffffffffffffff98,
                       __first._M_current,__last._M_current);
  ByteData(__return_storage_ptr__,
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           &insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00._M_current);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00._M_current);
  return __return_storage_ptr__;
}

Assistant:

ByteData Concat(const ByteDataClass& data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }